

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.h
# Opt level: O1

string * __thiscall
llbuild::basic::escapeForJSON<llvm::SmallString<16u>>
          (string *__return_storage_ptr__,basic *this,SmallString<16U> *in)

{
  byte bVar1;
  string *psVar2;
  char cVar3;
  long lVar4;
  byte *pbVar5;
  char *pcVar6;
  ostringstream ss;
  undefined1 auStack_1b8 [7];
  byte local_1b1;
  string *local_1b0;
  long local_1a8 [2];
  undefined8 uStack_198;
  uint auStack_190 [22];
  ios_base local_138 [112];
  char acStack_c8 [152];
  
  local_1b0 = __return_storage_ptr__;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  if (*(int *)(this + 8) != 0) {
    pbVar5 = *(byte **)this;
    do {
      bVar1 = *pbVar5;
      switch(bVar1) {
      case 8:
        lVar4 = 2;
        pcVar6 = "\\b";
        break;
      case 9:
        lVar4 = 2;
        pcVar6 = "\\t";
        break;
      case 10:
        lVar4 = 2;
        pcVar6 = "\\n";
        break;
      case 0xb:
switchD_001a73a3_caseD_b:
        if (0x1f < bVar1) {
          lVar4 = 1;
          pcVar6 = (char *)&local_1b1;
          local_1b1 = bVar1;
          break;
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\\u",2);
        *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
             *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5 | 8;
        *(undefined8 *)((long)&uStack_198 + *(long *)(local_1a8[0] + -0x18)) = 4;
        lVar4 = *(long *)(local_1a8[0] + -0x18);
        if (acStack_c8[lVar4 + 1] == '\0') {
          cVar3 = std::ios::widen((char)auStack_1b8 + (char)lVar4 + '\x10');
          acStack_c8[lVar4] = cVar3;
          acStack_c8[lVar4 + 1] = '\x01';
        }
        acStack_c8[lVar4] = '0';
        std::ostream::operator<<((ostream *)local_1a8,(int)(char)*pbVar5);
        goto LAB_001a74d3;
      case 0xc:
        lVar4 = 2;
        pcVar6 = "\\f";
        break;
      case 0xd:
        lVar4 = 2;
        pcVar6 = "\\r";
        break;
      default:
        if (bVar1 == 0x22) {
          lVar4 = 2;
          pcVar6 = "\\\"";
        }
        else {
          if (bVar1 != 0x5c) goto switchD_001a73a3_caseD_b;
          lVar4 = 2;
          pcVar6 = "\\\\";
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar6,lVar4);
LAB_001a74d3:
      pbVar5 = pbVar5 + 1;
    } while (pbVar5 != (byte *)((ulong)*(uint *)(this + 8) + *(long *)this));
  }
  psVar2 = local_1b0;
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  return psVar2;
}

Assistant:

std::string escapeForJSON(String const& in) {
    std::ostringstream ss;
    for (auto i = in.begin(); i != in.end(); i++) {
      switch (*i) {
      case '\\': ss << "\\\\"; break;
      case '"': ss << "\\\""; break;
      case '\b': ss << "\\b"; break;
      case '\n': ss << "\\n"; break;
      case '\f': ss << "\\f"; break;
      case '\r': ss << "\\r"; break;
      case '\t': ss << "\\t"; break;
      default:
        if ('\x00' <= *i && *i <= '\x1f') {
          ss << "\\u" << std::hex << std::setw(4) << std::setfill('0')
             << (int)*i;
        } else {
          ss << *i;
        }
      }
    }
    return ss.str();
  }